

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ErrorCodes.cpp
# Opt level: O0

void __thiscall
jbcoin::RPC::detail::ErrorCategory::add
          (ErrorCategory *this,error_code_i code,string *token,string *message)

{
  pair<std::__detail::_Node_iterator<std::pair<const_jbcoin::error_code_i,_jbcoin::RPC::ErrorInfo>,_false,_true>,_bool>
  pVar1;
  tuple<jbcoin::error_code_i_&,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
  local_58;
  tuple<jbcoin::error_code_i_&> local_40;
  _Node_iterator_base<std::pair<const_jbcoin::error_code_i,_jbcoin::RPC::ErrorInfo>,_true> local_38;
  pair<std::__detail::_Node_iterator<std::pair<const_jbcoin::error_code_i,_jbcoin::RPC::ErrorInfo>,_false,_true>,_bool>
  result;
  string *message_local;
  string *token_local;
  ErrorCategory *pEStack_10;
  error_code_i code_local;
  ErrorCategory *this_local;
  
  result._8_8_ = message;
  token_local._4_4_ = code;
  pEStack_10 = this;
  std::forward_as_tuple<jbcoin::error_code_i&>((error_code_i *)&local_40);
  std::
  forward_as_tuple<jbcoin::error_code_i&,std::__cxx11::string_const&,std::__cxx11::string_const&>
            (&local_58,(error_code_i *)((long)&token_local + 4),token,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)result._8_8_);
  pVar1 = std::
          unordered_map<jbcoin::error_code_i,jbcoin::RPC::ErrorInfo,std::hash<jbcoin::error_code_i>,std::equal_to<jbcoin::error_code_i>,std::allocator<std::pair<jbcoin::error_code_i_const,jbcoin::RPC::ErrorInfo>>>
          ::
          emplace<std::piecewise_construct_t_const&,std::tuple<jbcoin::error_code_i&>,std::tuple<jbcoin::error_code_i&,std::__cxx11::string_const&,std::__cxx11::string_const&>>
                    ((unordered_map<jbcoin::error_code_i,jbcoin::RPC::ErrorInfo,std::hash<jbcoin::error_code_i>,std::equal_to<jbcoin::error_code_i>,std::allocator<std::pair<jbcoin::error_code_i_const,jbcoin::RPC::ErrorInfo>>>
                      *)this,(piecewise_construct_t *)&std::piecewise_construct,&local_40,&local_58)
  ;
  local_38._M_cur =
       (__node_type *)
       pVar1.first.
       super__Node_iterator_base<std::pair<const_jbcoin::error_code_i,_jbcoin::RPC::ErrorInfo>,_true>
       ._M_cur;
  result.first.
  super__Node_iterator_base<std::pair<const_jbcoin::error_code_i,_jbcoin::RPC::ErrorInfo>,_true>.
  _M_cur._0_1_ = pVar1.second;
  if (((undefined1  [16])pVar1 & (undefined1  [16])0x1) == (undefined1  [16])0x0) {
    Throw<std::invalid_argument,char_const(&)[21]>((char (*) [21])"duplicate error code");
  }
  return;
}

Assistant:

void add (error_code_i code, std::string const& token,
        std::string const& message)
    {
        std::pair <Map::iterator, bool> result (
            m_map.emplace (std::piecewise_construct,
                std::forward_as_tuple (code), std::forward_as_tuple (
                    code, token, message)));
        if (! result.second)
            Throw<std::invalid_argument> ("duplicate error code");
    }